

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestCase::Run(TestCase *this)

{
  int iVar1;
  UnitTestImpl *this_00;
  TestEventListeners *this_01;
  TestEventListener *pTVar2;
  OsStackTraceGetterInterface *pOVar3;
  TimeInMillis TVar4;
  TimeInMillis TVar5;
  TestCase *in_RDI;
  int i;
  TimeInMillis start;
  char *in_stack_00000038;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  undefined8 in_stack_ffffffffffffffb8;
  UnitTestImpl *in_stack_ffffffffffffffc0;
  int local_34;
  
  if ((in_RDI->should_run_ & 1U) != 0) {
    this_00 = internal::GetUnitTestImpl();
    internal::UnitTestImpl::set_current_test_case(this_00,in_RDI);
    UnitTest::GetInstance();
    this_01 = UnitTest::listeners((UnitTest *)0x169d94);
    pTVar2 = TestEventListeners::repeater(this_01);
    (*pTVar2->_vptr_TestEventListener[6])(pTVar2,in_RDI);
    pOVar3 = internal::UnitTestImpl::os_stack_trace_getter(in_stack_ffffffffffffffc0);
    (*pOVar3->_vptr_OsStackTraceGetterInterface[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::TestCase,void>
              (this,(offset_in_TestCase_to_subr)repeater,in_stack_00000038);
    TVar4 = internal::GetTimeInMillis();
    for (local_34 = 0; iVar1 = total_test_count((TestCase *)0x169e1e), local_34 < iVar1;
        local_34 = local_34 + 1) {
      GetMutableTestInfo((TestCase *)in_stack_ffffffffffffffc0,
                         (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      TestInfo::Run((TestInfo *)this_00);
    }
    TVar5 = internal::GetTimeInMillis();
    in_RDI->elapsed_time_ = TVar5 - TVar4;
    pOVar3 = internal::UnitTestImpl::os_stack_trace_getter(in_stack_ffffffffffffffc0);
    (*pOVar3->_vptr_OsStackTraceGetterInterface[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::TestCase,void>
              (this,(offset_in_TestCase_to_subr)repeater,in_stack_00000038);
    (*pTVar2->_vptr_TestEventListener[10])(pTVar2,in_RDI);
    internal::UnitTestImpl::set_current_test_case(this_00,(TestCase *)0x0);
  }
  return;
}

Assistant:

void TestCase::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_case(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  repeater->OnTestCaseStart(*this);
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestCase::RunSetUpTestCase, "SetUpTestCase()");

  const internal::TimeInMillis start = internal::GetTimeInMillis();
  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Run();
  }
  elapsed_time_ = internal::GetTimeInMillis() - start;

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestCase::RunTearDownTestCase, "TearDownTestCase()");

  repeater->OnTestCaseEnd(*this);
  impl->set_current_test_case(NULL);
}